

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.h
# Opt level: O1

void __thiscall cnn::Timer::~Timer(Timer *this)

{
  pointer pcVar1;
  undefined8 in_RAX;
  long lVar2;
  ostream *poVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  lVar2 = std::chrono::_V2::system_clock::now();
  uStack_18._0_7_ = CONCAT16(0x5b,(undefined6)uStack_18);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)((long)&uStack_18 + 6),1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(this->msg)._M_dataplus._M_p,(this->msg)._M_string_length);
  uStack_18 = CONCAT17(0x20,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_18 + 7),1);
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - (this->start).__d.__r) * 1e-06);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ms]\n",5);
  pcVar1 = (this->msg)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->msg).field_2) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

~Timer() {
    auto stop = std::chrono::high_resolution_clock::now();
    std::cerr << '[' << msg << ' ' << std::chrono::duration<double, std::milli>(stop-start).count() << " ms]\n";
  }